

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O0

void __thiscall QSplitterHandle::paintEvent(QSplitterHandle *this,QPaintEvent *param_2)

{
  bool bVar1;
  Orientation OVar2;
  QSplitterHandlePrivate *pQVar3;
  QPalette *pQVar4;
  QStyle *pQVar5;
  QStyleOption *in_RSI;
  QWidget *in_RDI;
  undefined8 in_R9;
  long in_FS_OFFSET;
  QRect QVar6;
  QSplitterHandlePrivate *d;
  QPainter p;
  QStyleOption opt;
  QWidget *in_stack_ffffffffffffff68;
  StateFlag flags;
  QWidget *in_stack_ffffffffffffff70;
  QStyleOption *this_00;
  Representation local_60;
  Representation RStack_5c;
  QFontMetrics local_58;
  undefined7 uStack_57;
  QStyleOption local_50;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QSplitterHandle *)0x699725);
  local_50._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_50,&in_RDI->super_QPaintDevice);
  memset((void *)((long)&local_50 + 8),0xaa,0x40);
  QStyleOption::QStyleOption(in_RSI,(int)((ulong)pQVar3 >> 0x20),(int)pQVar3);
  QVar6 = QWidget::contentsRect(in_RDI);
  _local_60 = QVar6._0_8_;
  local_50.rect.x2.m_i = local_60.m_i;
  local_50.rect.y2.m_i = RStack_5c.m_i;
  _local_58 = QVar6._8_8_;
  local_50.fontMetrics = local_58;
  local_50._33_7_ = uStack_57;
  pQVar4 = QWidget::palette(in_stack_ffffffffffffff70);
  QPalette::operator=((QPalette *)&local_50.palette.currentGroup,(QPalette *)pQVar4);
  OVar2 = orientation((QSplitterHandle *)in_stack_ffffffffffffff70);
  flags = (StateFlag)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  if (OVar2 == Horizontal) {
    QFlags<QStyle::StateFlag>::QFlags((QFlags<QStyle::StateFlag> *)in_stack_ffffffffffffff70,flags);
  }
  else {
    QFlags<QStyle::StateFlag>::QFlags((QFlags<QStyle::StateFlag> *)in_stack_ffffffffffffff70,flags);
  }
  if (((byte)pQVar3->field_0x268 >> 1 & 1) != 0) {
    QFlags<QStyle::StateFlag>::operator|=
              ((QFlags<QStyle::StateFlag> *)&local_50.rect,State_MouseOver);
  }
  if (((byte)pQVar3->field_0x268 >> 2 & 1) != 0) {
    QFlags<QStyle::StateFlag>::operator|=((QFlags<QStyle::StateFlag> *)&local_50.rect,State_Sunken);
  }
  bVar1 = QWidget::isEnabled((QWidget *)0x699841);
  if (bVar1) {
    QFlags<QStyle::StateFlag>::operator|=((QFlags<QStyle::StateFlag> *)&local_50.rect,State_Enabled)
    ;
  }
  QWidget::parentWidget((QWidget *)0x699864);
  pQVar5 = QWidget::style(in_stack_ffffffffffffff68);
  this_00 = &local_50;
  (**(code **)(*(long *)pQVar5 + 0xb8))
            (pQVar5,0x1c,(long)&local_50 + 8U,this_00,pQVar3->s,in_R9,(long)&local_50 + 8U);
  QStyleOption::~QStyleOption(this_00);
  QPainter::~QPainter((QPainter *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSplitterHandle::paintEvent(QPaintEvent *)
{
    Q_D(QSplitterHandle);
    QPainter p(this);
    QStyleOption opt(0);
    opt.rect = contentsRect();
    opt.palette = palette();
    if (orientation() == Qt::Horizontal)
        opt.state = QStyle::State_Horizontal;
    else
        opt.state = QStyle::State_None;
    if (d->hover)
        opt.state |= QStyle::State_MouseOver;
    if (d->pressed)
        opt.state |= QStyle::State_Sunken;
    if (isEnabled())
        opt.state |= QStyle::State_Enabled;
    parentWidget()->style()->drawControl(QStyle::CE_Splitter, &opt, &p, d->s);
}